

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndpointInfo.cpp
# Opt level: O0

string * __thiscall helics::EndpointInfo::getSourceTargets_abi_cxx11_(EndpointInfo *this)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  EndpointInformation *src;
  const_iterator __end4;
  const_iterator __begin4;
  vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_> *__range4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  char cVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  _Alloc_hider in_stack_ffffffffffffffb8;
  __normal_iterator<const_helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
  local_18;
  undefined1 *local_10;
  
  cVar4 = (char)((ulong)in_stack_ffffffffffffff98 >> 0x38);
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4f684f);
  if ((bVar1) &&
     (bVar1 = std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
              ::empty((vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
                       *)in_RDI), !bVar1)) {
    sVar2 = std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>::
            size((vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
                  *)((long)&in_RDI[6].field_2 + 8));
    if (sVar2 == 1) {
      std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>::front
                ((vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
                  *)in_stack_ffffffffffffff90);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
    else {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(in_RDI,cVar4);
      local_10 = (undefined1 *)((long)&in_RDI[6].field_2 + 8);
      local_18._M_current =
           (EndpointInformation *)
           std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>::
           begin((vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
                  *)in_stack_ffffffffffffff88);
      std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>::end
                ((vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
                  *)in_stack_ffffffffffffff88);
      while (bVar1 = __gnu_cxx::
                     operator==<const_helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
                               ((__normal_iterator<const_helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
                                 *)in_stack_ffffffffffffff90,
                                (__normal_iterator<const_helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
                                 *)in_stack_ffffffffffffff88), ((bVar1 ^ 0xffU) & 1) != 0) {
        __gnu_cxx::
        __normal_iterator<const_helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
        ::operator*(&local_18);
        in_stack_ffffffffffffff90 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 9);
        __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &stack0xffffffffffffffb8;
        generateJsonQuotedString((string *)in_stack_ffffffffffffffb8._M_p);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (in_RDI,__str);
        cVar4 = (char)((ulong)__str >> 0x38);
        std::__cxx11::string::~string(in_stack_ffffffffffffff90);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back(in_RDI,cVar4);
        __gnu_cxx::
        __normal_iterator<const_helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
        ::operator++(&local_18);
      }
      pvVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_ffffffffffffff90);
      *pvVar3 = ']';
    }
  }
  return (string *)(in_RDI + 9);
}

Assistant:

const std::string& EndpointInfo::getSourceTargets() const
{
    if (sourceTargets.empty()) {
        if (!sourceInformation.empty()) {
            if (sourceInformation.size() == 1) {
                sourceTargets = sourceInformation.front().key;
            } else {
                sourceTargets.push_back('[');
                for (const auto& src : sourceInformation) {
                    sourceTargets.append(generateJsonQuotedString(src.key));
                    sourceTargets.push_back(',');
                }
                sourceTargets.back() = ']';
            }
        }
    }
    return sourceTargets;
}